

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::GatherGLSLCompile::Sampling_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "    textureGather(tex_2d,vec2(1));          \n    textureGather(itex_cube,vec3(1));       \n    textureGather(utex_2da,vec3(1));        \n    textureGather(tex_2ds,vec2(1), 0.5);    \n    textureGather(tex_cubes,vec3(1), 0.5);  \n    textureGather(tex_2das,vec3(1), 0.5);   \n    textureGatherOffset(tex_2d,vec2(1), ivec2(0));          \n    textureGatherOffset(utex_2da,vec3(1), ivec2(0));        \n    textureGatherOffset(tex_2ds,vec2(1), 0.5, ivec2(0));    \n    textureGatherOffset(tex_2das,vec3(1), 0.5, ivec2(0));   \n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Sampling()
	{
		return "    textureGather(tex_2d,vec2(1));          \n"
			   "    textureGather(itex_cube,vec3(1));       \n"
			   "    textureGather(utex_2da,vec3(1));        \n"
			   ""
			   "    textureGather(tex_2ds,vec2(1), 0.5);    \n"
			   "    textureGather(tex_cubes,vec3(1), 0.5);  \n"
			   "    textureGather(tex_2das,vec3(1), 0.5);   \n"
			   ""
			   "    textureGatherOffset(tex_2d,vec2(1), ivec2(0));          \n"
			   "    textureGatherOffset(utex_2da,vec3(1), ivec2(0));        \n"
			   ""
			   "    textureGatherOffset(tex_2ds,vec2(1), 0.5, ivec2(0));    \n"
			   "    textureGatherOffset(tex_2das,vec3(1), 0.5, ivec2(0));   \n";
	}